

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

ktx_error_code_e __thiscall
anon_unknown.dwarf_c633::TextureWriterTestHelper<unsigned_short,_2U,_33324U>::copyImagesToTexture
          (TextureWriterTestHelper<unsigned_short,_2U,_33324U> *this,ktxTexture1 *texture)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  reference this_00;
  unsigned_short *puVar4;
  undefined8 in_RSI;
  long in_RDI;
  ktx_uint8_t *imageDataPtr;
  ktx_size_t imageBytes;
  ktx_uint32_t faceSlice;
  ktx_uint32_t layer;
  ktx_uint32_t level;
  ktx_error_code_e result;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  local_14 = KTX_SUCCESS;
  local_18 = 0;
  do {
    sVar1 = std::
            vector<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
            ::size((vector<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
                    *)(in_RDI + 0xc0));
    if (sVar1 <= local_18) {
      return local_14;
    }
    local_1c = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
                             *)(in_RDI + 0xc0),(ulong)local_18);
      sVar1 = std::
              vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
              ::size(pvVar2);
      if (sVar1 <= local_1c) break;
      local_20 = 0;
      while( true ) {
        pvVar2 = std::
                 vector<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
                               *)(in_RDI + 0xc0),(ulong)local_18);
        pvVar3 = std::
                 vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
                 ::operator[](pvVar2,(ulong)local_1c);
        sVar1 = std::
                vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::size(pvVar3);
        if (sVar1 <= local_20) break;
        pvVar2 = std::
                 vector<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
                               *)(in_RDI + 0xc0),(ulong)local_18);
        pvVar3 = std::
                 vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
                 ::operator[](pvVar2,(ulong)local_1c);
        this_00 = std::
                  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                  ::operator[](pvVar3,(ulong)local_20);
        sVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(this_00);
        pvVar2 = std::
                 vector<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
                               *)(in_RDI + 0xc0),(ulong)local_18);
        pvVar3 = std::
                 vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
                 ::operator[](pvVar2,(ulong)local_1c);
        std::
        vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
        ::operator[](pvVar3,(ulong)local_20);
        puVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x14d9a1);
        local_14 = ktxTexture1_SetImageFromMemory
                             (in_RSI,local_18,local_1c,local_20,puVar4,sVar1 << 1);
        if (local_14 != KTX_SUCCESS) break;
        local_20 = local_20 + 1;
      }
      local_1c = local_1c + 1;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

KTX_error_code
    copyImagesToTexture(ktxTexture1* texture) {
        KTX_error_code result = KTX_SUCCESS;

        for (ktx_uint32_t level = 0; level < images.size(); level++) {
            for (ktx_uint32_t layer = 0; layer < images[level].size(); layer++) {
                for (ktx_uint32_t faceSlice = 0; faceSlice < images[level][layer].size(); faceSlice++) {
                    ktx_size_t imageBytes = images[level][layer][faceSlice].size() * sizeof(component_type);
                    ktx_uint8_t* imageDataPtr = (ktx_uint8_t*)(images[level][layer][faceSlice].data());
                    result = ktxTexture1_SetImageFromMemory(texture,
                                                            level, layer,
                                                            faceSlice,
                                                            imageDataPtr,
                                                            imageBytes);
                   if (result != KTX_SUCCESS)
                       break;
                }
            }
        }
        return result;
    }